

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O3

void search_in_and_exp_files(string *path,list<int,_std::allocator<int>_> *files_to_run)

{
  size_t *psVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  int iVar5;
  long lVar6;
  list<int,_std::allocator<int>_> *plVar7;
  undefined1 *puVar8;
  undefined1 auVar9 [8];
  size_t sVar10;
  uint uVar11;
  uint uVar12;
  DIR *__dirp;
  dirent *pdVar13;
  size_t sVar14;
  _List_node_base *p_Var15;
  long *plVar16;
  undefined8 *puVar17;
  string *psVar18;
  ulong uVar19;
  long *plVar20;
  undefined8 uVar21;
  _Alloc_hider _Var22;
  undefined1 auVar23 [8];
  char *pcVar24;
  uint uVar25;
  undefined8 uStack_100;
  long *local_f8;
  list<int,_std::allocator<int>_> *local_f0;
  undefined1 *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string file_name;
  list<int,_std::allocator<int>_> in_files;
  long local_58;
  long lStack_50;
  undefined1 local_48 [8];
  list<int,_std::allocator<int>_> exp_files;
  
  local_e8 = (undefined1 *)&local_f8;
  file_name.field_2._8_8_ = (long)&file_name.field_2 + 8;
  in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev
       = (_List_node_base *)0x0;
  local_48 = (undefined1  [8])local_48;
  exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  lVar6 = -((ulong)((int)path->_M_string_length + 1) + 0xf & 0xfffffffffffffff0);
  pcVar24 = (path->_M_dataplus)._M_p;
  local_f0 = files_to_run;
  in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
       = (_List_node_base *)file_name.field_2._8_8_;
  exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)local_48;
  *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108c54;
  strcpy((char *)((long)&local_f8 + lVar6),pcVar24);
  *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108c5c;
  __dirp = opendir((char *)((long)&local_f8 + lVar6));
  if (__dirp != (DIR *)0x0) {
    psVar1 = &in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
    while( true ) {
      *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108c7b;
      pdVar13 = readdir(__dirp);
      if (pdVar13 == (dirent *)0x0) break;
      local_a0 = (undefined1  [8])&file_name._M_string_length;
      *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108ca1;
      sVar14 = strlen(pdVar13->d_name);
      *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108cb4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,pdVar13->d_name,pdVar13->d_name + sVar14);
      *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108cc8;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)psVar1,"^in([0-9]+)\\.txt$"
                 ,0x10);
      *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108cd7;
      add_file_if_regex_ok
                ((regex *)psVar1,(list<int,_std::allocator<int>_> *)((long)&file_name.field_2 + 8),
                 (string *)local_a0);
      *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108cdf;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)psVar1);
      *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108cf3;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)psVar1,
                 "^exp([0-9]+)\\.txt$",0x10);
      *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108d02;
      add_file_if_regex_ok
                ((regex *)psVar1,(list<int,_std::allocator<int>_> *)local_48,(string *)local_a0);
      *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108d0a;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)psVar1);
      auVar23 = local_a0;
      if (local_a0 != (undefined1  [8])&file_name._M_string_length) {
        *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108d26;
        operator_delete((void *)auVar23);
      }
    }
    *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108d33;
    closedir(__dirp);
    *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108d3c;
    std::__cxx11::list<int,_std::allocator<int>_>::sort
              ((list<int,_std::allocator<int>_> *)((long)&file_name.field_2 + 8));
    *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108d45;
    std::__cxx11::list<int,_std::allocator<int>_>::sort((list<int,_std::allocator<int>_> *)local_48)
    ;
    if ((undefined1 *)file_name.field_2._8_8_ != (undefined1 *)((long)&file_name.field_2 + 8)) {
      uVar21 = file_name.field_2._8_8_;
      do {
        uVar2 = *(uint *)(uVar21 + 0x10);
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar25 = 1;
        if (9 < uVar3) {
          uVar19 = (ulong)uVar3;
          uVar11 = 4;
          do {
            uVar25 = uVar11;
            uVar12 = (uint)uVar19;
            if (uVar12 < 100) {
              uVar25 = uVar25 - 2;
              goto LAB_00108dbb;
            }
            if (uVar12 < 1000) {
              uVar25 = uVar25 - 1;
              goto LAB_00108dbb;
            }
            if (uVar12 < 10000) goto LAB_00108dbb;
            uVar19 = uVar19 / 10000;
            uVar11 = uVar25 + 4;
          } while (99999 < uVar12);
          uVar25 = uVar25 + 1;
        }
LAB_00108dbb:
        local_a0 = (undefined1  [8])&file_name._M_string_length;
        local_f8 = (long *)uVar21;
        *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108def;
        std::__cxx11::string::_M_construct
                  ((ulong)local_a0,(char)uVar25 - (char)((int)uVar2 >> 0x1f));
        pcVar24 = (char *)((long)local_a0 + (ulong)(uVar2 >> 0x1f));
        *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108e03;
        std::__detail::__to_chars_10_impl<unsigned_int>(pcVar24,uVar25,uVar3);
        uVar3 = *(uint *)&((_List_node_base *)((long)local_48 + 0x10))->_M_next;
        if (uVar3 == uVar2) {
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108e19;
          p_Var15 = (_List_node_base *)operator_new(0x18);
          plVar7 = local_f0;
          *(uint *)&p_Var15[1]._M_next = uVar2;
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108e32;
          std::__detail::_List_node_base::_M_hook(p_Var15);
          _Var22._M_p = (pointer)local_48;
          psVar1 = &(plVar7->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
          super__List_node_base._M_prev =
               (_List_node_base *)
               ((long)&exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                       super__List_node_base._M_prev[-1]._M_prev + 7);
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108e46;
          std::__detail::_List_node_base::_M_unhook();
LAB_00109042:
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x109047;
          operator_delete(_Var22._M_p);
        }
        else if ((local_48 == (undefined1  [8])local_48) ||
                (iVar5 = uVar3 - uVar2, (int)uVar2 < (int)uVar3)) {
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108f8d;
          std::operator+(&local_e0,".txt is present, but exp",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0);
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108fa0;
          puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
          plVar16 = puVar17 + 2;
          if ((long *)*puVar17 == plVar16) {
            local_58 = *plVar16;
            lStack_50 = puVar17[3];
            in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
                 (size_t)&local_58;
          }
          else {
            local_58 = *plVar16;
            in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
                 (size_t)*puVar17;
          }
          *puVar17 = plVar16;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108ffa;
          std::operator+(&local_c0,"in",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0);
          sVar10 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x10900a;
          psVar18 = (string *)std::__cxx11::string::_M_append((char *)&local_c0,sVar10);
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x109017;
          write_colored_text(psVar18,red);
          _Var22._M_p = local_c0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            *(undefined8 *)((long)&uStack_100 + lVar6) = 0x109028;
            operator_delete(_Var22._M_p);
          }
          sVar10 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
          if ((long *)in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
              != &local_58) {
            *(undefined8 *)((long)&uStack_100 + lVar6) = 0x109036;
            operator_delete((void *)sVar10);
          }
          _Var22._M_p = local_e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_00109042;
        }
        else {
          while (SBORROW4(uVar3,uVar2) != iVar5 < 0) {
            *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108e95;
            std::operator+(&local_e0,".txt is present, but in",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0);
            *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108ea4;
            plVar16 = (long *)std::__cxx11::string::append((char *)&local_e0);
            plVar20 = plVar16 + 2;
            if ((long *)*plVar16 == plVar20) {
              local_58 = *plVar20;
              lStack_50 = plVar16[3];
              in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
                   (size_t)&local_58;
            }
            else {
              local_58 = *plVar20;
              in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
                   (size_t)*plVar16;
            }
            *plVar16 = (long)plVar20;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108efe;
            std::operator+(&local_c0,"exp",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0);
            sVar10 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
            *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108f0e;
            psVar18 = (string *)std::__cxx11::string::_M_append((char *)&local_c0,sVar10);
            *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108f1b;
            write_colored_text(psVar18,red);
            _Var22._M_p = local_c0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108f2c;
              operator_delete(_Var22._M_p);
            }
            sVar10 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
            if ((long *)in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
                != &local_58) {
              *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108f3a;
              operator_delete((void *)sVar10);
            }
            _Var22._M_p = local_e0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108f4b;
              operator_delete(_Var22._M_p);
            }
            auVar23 = local_48;
            exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
            super__List_node_base._M_prev =
                 (_List_node_base *)
                 ((long)&exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                         super__List_node_base._M_prev[-1]._M_prev + 7);
            *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108f5b;
            std::__detail::_List_node_base::_M_unhook();
            *(undefined8 *)((long)&uStack_100 + lVar6) = 0x108f63;
            operator_delete((void *)auVar23);
            uVar3 = *(uint *)&((_List_node_base *)((long)local_48 + 0x10))->_M_next;
            iVar5 = uVar3 - uVar2;
          }
        }
        auVar23 = local_a0;
        if (local_a0 != (undefined1  [8])&file_name._M_string_length) {
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x10905f;
          operator_delete((void *)auVar23);
        }
        uVar21 = *local_f8;
      } while ((undefined1 *)uVar21 != (undefined1 *)((long)&file_name.field_2 + 8));
    }
    if (local_48 != (undefined1  [8])local_48) {
      auVar23 = local_48;
      do {
        uVar2 = *(uint *)&((_List_node_base *)((long)auVar23 + 0x10))->_M_next;
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar25 = 1;
        if (9 < uVar3) {
          uVar19 = (ulong)uVar3;
          uVar11 = 4;
          do {
            uVar25 = uVar11;
            uVar12 = (uint)uVar19;
            if (uVar12 < 100) {
              uVar25 = uVar25 - 2;
              goto LAB_001090f8;
            }
            if (uVar12 < 1000) {
              uVar25 = uVar25 - 1;
              goto LAB_001090f8;
            }
            if (uVar12 < 10000) goto LAB_001090f8;
            uVar19 = uVar19 / 10000;
            uVar11 = uVar25 + 4;
          } while (99999 < uVar12);
          uVar25 = uVar25 + 1;
        }
LAB_001090f8:
        local_a0 = (undefined1  [8])&file_name._M_string_length;
        *(undefined8 *)((long)&uStack_100 + lVar6) = 0x10911a;
        std::__cxx11::string::_M_construct
                  ((ulong)local_a0,(char)uVar25 - (char)((int)uVar2 >> 0x1f));
        pcVar24 = (char *)((long)local_a0 + (ulong)(uVar2 >> 0x1f));
        *(undefined8 *)((long)&uStack_100 + lVar6) = 0x10912f;
        std::__detail::__to_chars_10_impl<unsigned_int>(pcVar24,uVar25,uVar3);
        *(undefined8 *)((long)&uStack_100 + lVar6) = 0x109148;
        std::operator+(&local_e0,".txt is present, but in",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
        *(undefined8 *)((long)&uStack_100 + lVar6) = 0x10915a;
        puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
        plVar16 = puVar17 + 2;
        if ((long *)*puVar17 == plVar16) {
          local_58 = *plVar16;
          lStack_50 = puVar17[3];
          in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
               (size_t)&local_58;
        }
        else {
          local_58 = *plVar16;
          in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
               (size_t)*puVar17;
        }
        *puVar17 = plVar16;
        puVar17[1] = 0;
        *(undefined1 *)(puVar17 + 2) = 0;
        *(undefined8 *)((long)&uStack_100 + lVar6) = 0x1091b4;
        std::operator+(&local_c0,"exp",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
        sVar10 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
        *(undefined8 *)((long)&uStack_100 + lVar6) = 0x1091c4;
        psVar18 = (string *)std::__cxx11::string::_M_append((char *)&local_c0,sVar10);
        *(undefined8 *)((long)&uStack_100 + lVar6) = 0x1091d1;
        write_colored_text(psVar18,red);
        _Var22._M_p = local_c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x1091e9;
          operator_delete(_Var22._M_p);
        }
        sVar10 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
        if ((long *)in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size !=
            &local_58) {
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x1091f7;
          operator_delete((void *)sVar10);
        }
        _Var22._M_p = local_e0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x10920f;
          operator_delete(_Var22._M_p);
        }
        auVar9 = local_a0;
        if (local_a0 != (undefined1  [8])&file_name._M_string_length) {
          *(undefined8 *)((long)&uStack_100 + lVar6) = 0x109227;
          operator_delete((void *)auVar9);
        }
        auVar23 = (undefined1  [8])((_List_node_base *)auVar23)->_M_next;
      } while (auVar23 != (undefined1  [8])local_48);
    }
  }
  puVar8 = local_e8;
  auVar23 = local_48;
  while (auVar23 != (undefined1  [8])local_48) {
    p_Var15 = ((_List_node_base *)auVar23)->_M_next;
    *(undefined8 *)(puVar8 + -8) = 0x109259;
    operator_delete((void *)auVar23);
    auVar23 = (undefined1  [8])p_Var15;
  }
  puVar17 = (undefined8 *)file_name.field_2._8_8_;
  while (puVar17 != (undefined8 *)((long)&file_name.field_2 + 8)) {
    puVar4 = (undefined8 *)*puVar17;
    *(undefined8 *)(puVar8 + -8) = 0x109276;
    operator_delete(puVar17);
    puVar17 = puVar4;
  }
  return;
}

Assistant:

void search_in_and_exp_files(const string &path, list<int> &files_to_run) {
    struct dirent *entry;

    list<int> in_files;
    list<int> exp_files;

    // Convert string to char-array
    int length = path.size();
    char char_path[length + 1];
    strcpy(char_path, path.c_str());

    // Open the directory
    DIR *dir = opendir(char_path);
    if (dir == nullptr) return;

    // Read each filename from the directory
    while ((entry = readdir(dir)) != nullptr) {
        string file_name = entry->d_name;

        /*
         * I just want to search for in1.txt, in2.txt, ..., in15.txt, in16.txt, ...
         * And I just want to extract the number 1, 2, ..., 15, 16, ..
         * See https://regex101.com for nice interactive explaining of the regex.
         * - ^      -> must start with what follows
         * - ^in    -> must start with 'in'
         * - (...)  -> first capture group -> get with $1
         * - [0-9]+ -> at least one digit
         * - \\.    -> a dot has to be present (note: in many languages, just one \ is required, also on https://regex101.com/)
         * - txt$   -> must end with txt
         */
        add_file_if_regex_ok(regex("^in([0-9]+)\\.txt$"), in_files, file_name);
        add_file_if_regex_ok(regex("^exp([0-9]+)\\.txt$"), exp_files, file_name);
    }
    closedir(dir);

    // Sort the file-lists
    in_files.sort();
    exp_files.sort();

    // Only add files to 'files_to_run', if the inXX.txt AND the expXX.txt are present:
    for (int in : in_files) {
        string i = to_string(in);
        if (exp_files.front() == in) {
            files_to_run.push_back(in);
            exp_files.pop_front();
        } else if (exp_files.empty() || exp_files.front() > in) {
            write_colored_text("in" + i += ".txt is present, but exp" + i + ".txt missing -> Skipping test!\n");
        } else {
            while (exp_files.front() < in) {
                write_colored_text("exp" + i += ".txt is present, but in" + i + ".txt missing -> Skipping test!\n");
                exp_files.pop_front();
            }
        }
    }
    // Possibly remaining exp-files (without in-files):
    for (int exp: exp_files) {
        string i = to_string(exp);
        write_colored_text("exp" + i += ".txt is present, but in" + i + ".txt missing -> Skipping test!\n");
    }
}